

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O0

int run_test_error_message(void)

{
  int iVar1;
  char *pcVar2;
  char local_38 [8];
  char buf [32];
  
  pcVar2 = uv_strerror(0);
  iVar1 = strcmp(pcVar2,"Success");
  if (iVar1 == 0) {
    pcVar2 = uv_strerror(-0x16);
    pcVar2 = strstr(pcVar2,"Success");
    if (pcVar2 != (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-error.c"
              ,0x32,"strstr(uv_strerror(UV_EINVAL), \"Success\") == NULL");
      abort();
    }
    pcVar2 = uv_strerror(0x539);
    iVar1 = strcmp(pcVar2,"Unknown error");
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-error.c"
              ,0x33,"strcmp(uv_strerror(1337), \"Unknown error\") == 0");
      abort();
    }
    pcVar2 = uv_strerror(-0x539);
    iVar1 = strcmp(pcVar2,"Unknown error");
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-error.c"
              ,0x34,"strcmp(uv_strerror(-1337), \"Unknown error\") == 0");
      abort();
    }
    pcVar2 = uv_strerror_r(-0x16,local_38,0x20);
    pcVar2 = strstr(pcVar2,"Success");
    if (pcVar2 != (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-error.c"
              ,0x36,"strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), \"Success\") == NULL");
      abort();
    }
    pcVar2 = uv_strerror_r(0x539,local_38,0x20);
    pcVar2 = strstr(pcVar2,"1337");
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-error.c"
              ,0x37,"strstr(uv_strerror_r(1337, buf, sizeof(buf)), \"1337\") != NULL");
      abort();
    }
    pcVar2 = uv_strerror_r(-0x539,local_38,0x20);
    pcVar2 = strstr(pcVar2,"-1337");
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-error.c"
              ,0x38,"strstr(uv_strerror_r(-1337, buf, sizeof(buf)), \"-1337\") != NULL");
      abort();
    }
  }
  else {
    printf("i18n error messages detected, skipping test.\n");
  }
  return 0;
}

Assistant:

TEST_IMPL(error_message) {
  char buf[32];

  /* Cop out. Can't do proper checks on systems with
   * i18n-ized error messages...
   */
  if (strcmp(uv_strerror(0), "Success") != 0) {
    printf("i18n error messages detected, skipping test.\n");
    return 0;
  }

  ASSERT(strstr(uv_strerror(UV_EINVAL), "Success") == NULL);
  ASSERT(strcmp(uv_strerror(1337), "Unknown error") == 0);
  ASSERT(strcmp(uv_strerror(-1337), "Unknown error") == 0);

  ASSERT(strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), "Success") == NULL);
  ASSERT(strstr(uv_strerror_r(1337, buf, sizeof(buf)), "1337") != NULL);
  ASSERT(strstr(uv_strerror_r(-1337, buf, sizeof(buf)), "-1337") != NULL);

  return 0;
}